

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline.c
# Opt level: O2

statement * copy_one_statement(dmr_C *C,statement *stmt)

{
  expression *peVar1;
  statement *dst;
  symbol *psVar2;
  symbol_list *psVar3;
  symbol *psVar4;
  expression_list *peVar5;
  statement *psVar6;
  statement *psVar7;
  expression *expr;
  undefined1 local_60 [8];
  ptr_list_iter symiter__;
  
  if (stmt == (statement *)0x0) {
    return (statement *)0x0;
  }
  dst = stmt;
  switch(stmt->type) {
  case STMT_NONE:
    break;
  case STMT_DECLARATION:
    dst = dup_statement(C,stmt);
    (dst->field_2).field_1.expression = (expression *)0x0;
    symiter__._16_8_ = &dst->field_2;
    ptrlist_forward_iterator
              ((ptr_list_iter *)local_60,(ptr_list *)(stmt->field_2).field_1.expression);
    psVar2 = (symbol *)ptrlist_iter_next((ptr_list_iter *)local_60);
    while (psVar2 != (symbol *)0x0) {
      psVar4 = copy_symbol(C,stmt->pos,psVar2);
      if (psVar4 != psVar2) {
        peVar1 = copy_expression(C,(psVar2->field_14).field_2.initializer);
        (psVar4->field_14).field_2.initializer = peVar1;
      }
      ptrlist_add((ptr_list **)symiter__._16_8_,psVar4,&C->ptrlist_allocator);
      psVar2 = (symbol *)ptrlist_iter_next((ptr_list_iter *)local_60);
    }
    break;
  case STMT_EXPRESSION:
  case STMT_CONTEXT:
  case STMT_RANGE:
    peVar1 = copy_expression(C,(stmt->field_2).field_1.expression);
    if (peVar1 != (stmt->field_2).field_1.expression) {
      dst = dup_statement(C,stmt);
      (dst->field_2).field_1.expression = peVar1;
    }
    break;
  case STMT_COMPOUND:
    dst = dmrC_alloc_statement(C,stmt->pos,3);
    dmrC_copy_statement(C,stmt,dst);
    break;
  case STMT_IF:
    psVar7 = (stmt->field_2).field_3.if_true;
    psVar6 = (stmt->field_2).field_3.if_false;
    peVar1 = copy_expression(C,(stmt->field_2).field_1.expression);
    psVar7 = copy_one_statement(C,psVar7);
    psVar6 = copy_one_statement(C,psVar6);
    if ((((stmt->field_2).field_1.expression != peVar1) ||
        ((statement *)(stmt->field_2).field_1.context != psVar7)) ||
       ((stmt->field_2).field_3.if_false != psVar6)) {
      dst = dup_statement(C,stmt);
      (dst->field_2).field_1.expression = peVar1;
      (dst->field_2).field_3.if_true = psVar7;
      (dst->field_2).field_3.if_false = psVar6;
    }
    break;
  case STMT_RETURN:
    peVar1 = copy_expression(C,(stmt->field_2).field_1.expression);
    psVar2 = copy_symbol(C,stmt->pos,(stmt->field_2).field_2.ret_target);
    dst = dup_statement(C,stmt);
    (dst->field_2).field_1.expression = peVar1;
    (dst->field_2).field_2.ret_target = psVar2;
    break;
  case STMT_CASE:
    dst = dup_statement(C,stmt);
    psVar2 = copy_symbol(C,dst->pos,(dst->field_2).field_6.case_label);
    (dst->field_2).field_6.case_label = psVar2;
    (psVar2->field_14).field_2.stmt = dst;
    peVar1 = copy_expression(C,(dst->field_2).field_1.expression);
    (dst->field_2).field_1.expression = peVar1;
    peVar1 = copy_expression(C,(dst->field_2).field_1.context);
    (dst->field_2).field_1.context = peVar1;
    psVar3 = (symbol_list *)copy_one_statement(C,(dst->field_2).field_3.if_false);
    goto LAB_001110d2;
  case STMT_SWITCH:
    psVar2 = copy_symbol(C,stmt->pos,(stmt->field_2).field_4.inline_fn);
    psVar4 = copy_symbol(C,stmt->pos,(stmt->field_2).field_6.case_label);
    peVar1 = copy_expression(C,(stmt->field_2).field_1.expression);
    psVar7 = copy_one_statement(C,(stmt->field_2).field_3.if_true);
    dst = dup_statement(C,stmt);
    psVar3 = copy_symbol_list(C,(psVar4->field_14).field_2.symbol_list);
    (psVar4->field_14).field_2.symbol_list = psVar3;
    (dst->field_2).field_4.inline_fn = psVar2;
    (dst->field_2).field_6.case_label = psVar4;
    (dst->field_2).field_1.expression = peVar1;
    (dst->field_2).field_3.if_true = psVar7;
    break;
  case STMT_ITERATOR:
    dst = dup_statement(C,stmt);
    psVar2 = copy_symbol(C,dst->pos,(dst->field_2).field_5.label_identifier);
    (dst->field_2).field_5.label_identifier = psVar2;
    psVar2 = copy_symbol(C,dst->pos,(dst->field_2).field_2.ret_target);
    (dst->field_2).field_2.ret_target = psVar2;
    psVar3 = copy_symbol_list(C,(dst->field_2).field_8.iterator_syms);
    (dst->field_2).field_8.iterator_syms = psVar3;
    psVar7 = copy_one_statement(C,(dst->field_2).field_4.args);
    (dst->field_2).field_4.args = psVar7;
    peVar1 = copy_expression(C,(dst->field_2).field_8.iterator_pre_condition);
    (dst->field_2).field_8.iterator_pre_condition = peVar1;
    psVar7 = copy_one_statement(C,(dst->field_2).field_8.iterator_statement);
    (dst->field_2).field_8.iterator_statement = psVar7;
    psVar7 = copy_one_statement(C,(dst->field_2).field_8.iterator_post_statement);
    (dst->field_2).field_8.iterator_post_statement = psVar7;
    peVar1 = copy_expression(C,(dst->field_2).field_8.iterator_post_condition);
    (dst->field_2).field_8.iterator_post_condition = peVar1;
    break;
  case STMT_LABEL:
    dst = dup_statement(C,stmt);
    psVar2 = copy_symbol(C,dst->pos,(dst->field_2).field_5.label_identifier);
    (dst->field_2).field_5.label_identifier = psVar2;
    peVar5 = (expression_list *)copy_one_statement(C,(dst->field_2).field_3.if_true);
    goto LAB_00110f70;
  case STMT_GOTO:
    dst = dup_statement(C,stmt);
    psVar2 = copy_symbol(C,dst->pos,(dst->field_2).field_5.label_identifier);
    (dst->field_2).field_5.label_identifier = psVar2;
    peVar1 = copy_expression(C,(dst->field_2).field_1.context);
    (dst->field_2).field_1.context = peVar1;
    psVar3 = copy_symbol_list(C,(dst->field_2).field_8.iterator_syms);
LAB_001110d2:
    (dst->field_2).field_8.iterator_syms = psVar3;
    break;
  case STMT_ASM:
    dst = dup_statement(C,stmt);
    peVar5 = copy_asm_constraints(C,(dst->field_2).field_10.asm_inputs);
    (dst->field_2).field_10.asm_inputs = peVar5;
    peVar5 = copy_asm_constraints(C,(dst->field_2).field_10.asm_outputs);
LAB_00110f70:
    (dst->field_2).field_10.asm_outputs = peVar5;
    break;
  default:
    dmrC_warning(C,stmt->pos,"trying to copy statement type %d");
  }
  return dst;
}

Assistant:

static struct statement *copy_one_statement(struct dmr_C *C, struct statement *stmt)
{
	if (!stmt)
		return NULL;
	switch(stmt->type) {
	case STMT_NONE:
		break;
	case STMT_DECLARATION: {
		struct symbol *sym;
		struct statement *newstmt = dup_statement(C, stmt);
		newstmt->declaration = NULL;
		FOR_EACH_PTR(stmt->declaration, sym) {
			struct symbol *newsym = copy_symbol(C, stmt->pos, sym);
			if (newsym != sym)
				newsym->initializer = copy_expression(C, sym->initializer);
			dmrC_add_symbol(C, &newstmt->declaration, newsym);
		} END_FOR_EACH_PTR(sym);
		stmt = newstmt;
		break;
	}
	case STMT_CONTEXT:
	case STMT_EXPRESSION: {
		struct expression *expr = copy_expression(C, stmt->expression);
		if (expr == stmt->expression)
			break;
		stmt = dup_statement(C, stmt);
		stmt->expression = expr;
		break;
	}
	case STMT_RANGE: {
		struct expression *expr = copy_expression(C, stmt->range_expression);
		if (expr == stmt->expression)
			break;
		stmt = dup_statement(C, stmt);
		stmt->range_expression = expr;
		break;
	}
	case STMT_COMPOUND: {
		struct statement *newst = dmrC_alloc_statement(C, stmt->pos, STMT_COMPOUND);
		dmrC_copy_statement(C, stmt, newst);
		stmt = newst;
		break;
	}
	case STMT_IF: {
		struct expression *cond = stmt->if_conditional;
		struct statement *trues = stmt->if_true;
		struct statement *falses = stmt->if_false;

		cond = copy_expression(C, cond);
		trues = copy_one_statement(C, trues);
		falses = copy_one_statement(C, falses);
		if (stmt->if_conditional == cond &&
		    stmt->if_true == trues &&
		    stmt->if_false == falses)
			break;
		stmt = dup_statement(C, stmt);
		stmt->if_conditional = cond;
		stmt->if_true = trues;
		stmt->if_false = falses;
		break;
	}
	case STMT_RETURN: {
		struct expression *retval = copy_expression(C, stmt->ret_value);
		struct symbol *sym = copy_symbol(C, stmt->pos, stmt->ret_target);

		stmt = dup_statement(C, stmt);
		stmt->ret_value = retval;
		stmt->ret_target = sym;
		break;
	}
	case STMT_CASE: {
		stmt = dup_statement(C, stmt);
		stmt->case_label = copy_symbol(C, stmt->pos, stmt->case_label);
		stmt->case_label->stmt = stmt;
		stmt->case_expression = copy_expression(C, stmt->case_expression);
		stmt->case_to = copy_expression(C, stmt->case_to);
		stmt->case_statement = copy_one_statement(C, stmt->case_statement);
		break;
	}
	case STMT_SWITCH: {
		struct symbol *switch_break = copy_symbol(C, stmt->pos, stmt->switch_break);
		struct symbol *switch_case = copy_symbol(C, stmt->pos, stmt->switch_case);
		struct expression *expr = copy_expression(C, stmt->switch_expression);
		struct statement *switch_stmt = copy_one_statement(C, stmt->switch_statement);

		stmt = dup_statement(C, stmt);
		switch_case->symbol_list = copy_symbol_list(C, switch_case->symbol_list);
		stmt->switch_break = switch_break;
		stmt->switch_case = switch_case;
		stmt->switch_expression = expr;
		stmt->switch_statement = switch_stmt;
		break;		
	}
	case STMT_ITERATOR: {
		stmt = dup_statement(C, stmt);
		stmt->iterator_break = copy_symbol(C, stmt->pos, stmt->iterator_break);
		stmt->iterator_continue = copy_symbol(C, stmt->pos, stmt->iterator_continue);
		stmt->iterator_syms = copy_symbol_list(C, stmt->iterator_syms);

		stmt->iterator_pre_statement = copy_one_statement(C, stmt->iterator_pre_statement);
		stmt->iterator_pre_condition = copy_expression(C, stmt->iterator_pre_condition);

		stmt->iterator_statement = copy_one_statement(C, stmt->iterator_statement);

		stmt->iterator_post_statement = copy_one_statement(C, stmt->iterator_post_statement);
		stmt->iterator_post_condition = copy_expression(C, stmt->iterator_post_condition);
		break;
	}
	case STMT_LABEL: {
		stmt = dup_statement(C, stmt);
		stmt->label_identifier = copy_symbol(C, stmt->pos, stmt->label_identifier);
		stmt->label_statement = copy_one_statement(C, stmt->label_statement);
		break;
	}
	case STMT_GOTO: {
		stmt = dup_statement(C, stmt);
		stmt->goto_label = copy_symbol(C, stmt->pos, stmt->goto_label);
		stmt->goto_expression = copy_expression(C, stmt->goto_expression);
		stmt->target_list = copy_symbol_list(C, stmt->target_list);
		break;
	}
	case STMT_ASM: {
		stmt = dup_statement(C, stmt);
		stmt->asm_inputs = copy_asm_constraints(C, stmt->asm_inputs);
		stmt->asm_outputs = copy_asm_constraints(C, stmt->asm_outputs);
		/* no need to dup "clobbers", since they are all constant strings */
		break;
	}
	default:
		dmrC_warning(C, stmt->pos, "trying to copy statement type %d", stmt->type);
		break;
	}
	return stmt;
}